

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding_validators.h
# Opt level: O2

bool cppcms::encoding::iso_8859_6_valid<char_const*>(char *p,char *e,size_t *count)

{
  byte bVar1;
  size_t sVar2;
  
  sVar2 = *count;
  for (; sVar2 = sVar2 + 1, p != e; p = (char *)((byte *)p + 1)) {
    *count = sVar2;
    bVar1 = *p;
    if (((0xd < bVar1) || ((0x2600U >> (bVar1 & 0x1f) & 1) == 0)) &&
       (((((byte)(bVar1 + 0x52) < 0xd || ((bVar1 < 0x20 || ((byte)(bVar1 + 0x81) < 0x21)))) ||
         ((bVar1 - 0xa1 < 0x20 && ((0xb80007f7U >> (bVar1 - 0xa1 & 0x1f) & 1) != 0)))) ||
        ((0xf2 < bVar1 || ((byte)(bVar1 + 0x25) < 5)))))) break;
  }
  return p == e;
}

Assistant:

bool iso_8859_6_valid(Iterator p,Iterator e,size_t &count)
	{
		while(p!=e) {
			count++;
			unsigned c=(unsigned char)*p++;
			if(c==0x09 || c==0xA || c==0xD)
				continue;
			if(c<0x20 || (0x7F<=c && c<0xA0))
				return false;
			if(	(0xA1<=c && c<=0xA3) ||
			 	(0xA5 <=c && c<= 0xAB) || 
				(0xAE <=c && c<= 0xBA) ||
				(0xBC <=c && c<= 0xBE) ||
				 0xC0 == c		||
				(0xDB <=c && c<= 0xDF) ||
				(0xF3 <=c && c<= 0xFF))
			{
				return false;
			}
		}
		return true;
	}